

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsp.cc
# Opt level: O1

void bsp_move(void *payload,bsp_size_t reception_nbytes)

{
  pointer ppVar1;
  ulong uVar2;
  Bsmp *pBVar3;
  ulong __n;
  
  if ((s_spmd == (Spmd *)0x0) || (s_spmd->m_closed == true)) {
    bsp_abort("bsp_move: can only be called within SPMD section\n");
  }
  if (reception_nbytes < 0) {
    bsp_abort("bsp_move: size argument may not be negative\n");
  }
  if (0 < reception_nbytes && payload == (void *)0x0) {
    bsp_abort("bsp_move: payload may not be NULL if reception_nbytes is non-zero\n");
  }
  if ((s_bsmp->m_payloads).
      super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (s_bsmp->m_payloads).
      super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    bsp_abort("bsp_move: Message queue was empty\n");
  }
  pBVar3 = s_bsmp;
  ppVar1 = (s_bsmp->m_payloads).
           super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  uVar2 = ppVar1[-1].second;
  __n = (long)reception_nbytes;
  if (uVar2 < (ulong)(long)reception_nbytes) {
    __n = uVar2;
  }
  memcpy(payload,(void *)((long)(s_bsmp->m_payload_buffer).m_aligned_ptr + ppVar1[-1].first),__n);
  pBVar3->m_total_n_messages = pBVar3->m_total_n_messages - 1;
  ppVar1 = (pBVar3->m_payloads).
           super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pBVar3->m_total_payload = pBVar3->m_total_payload - ppVar1[-1].second;
  (pBVar3->m_payloads).
  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = ppVar1 + -1;
  return;
}

Assistant:

void bsp_move( void * payload, bsp_size_t reception_nbytes )
{
     if (!s_spmd || s_spmd->closed())
        bsp_abort("bsp_move: can only be called within SPMD section\n");

     if (reception_nbytes < 0 )
         bsp_abort("bsp_move: size argument may not be negative\n");

     if ( payload == NULL && reception_nbytes > 0 )
        bsp_abort("bsp_move: payload may not be NULL if reception_nbytes is non-zero\n");

     if ( s_bsmp->empty() )
         bsp_abort("bsp_move: Message queue was empty\n");

#ifdef PROFILE
     TicToc t( TicToc::BSMP, s_bsmp->payload_size() );
#endif

     size_t size = std::min< size_t >( reception_nbytes, s_bsmp->payload_size() );
     std::memcpy( payload, s_bsmp->payload(), size );
     s_bsmp->pop();
}